

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

void __thiscall
QHttpNetworkConnectionPrivate::startHostInfoLookup(QHttpNetworkConnectionPrivate *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  qsizetype qVar4;
  bool bVar5;
  Capabilities CVar6;
  NetworkLayerProtocol NVar7;
  QNetworkProxy *this_00;
  long in_FS_OFFSET;
  bool immediateResultValid;
  int hostLookupId;
  QHostAddress temp;
  QHostInfo hostInfo;
  char local_75 [5];
  QHostAddress local_70;
  QString local_68;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->networkLayerState = HostLookupPending;
  local_68.d.d = (this->hostName).d.d;
  local_68.d.ptr = (this->hostName).d.ptr;
  local_68.d.size = (this->hostName).d.size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = &this->networkProxy;
  CVar6 = QNetworkProxy::capabilities(this_00);
  if (((uint)CVar6.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
             super_QFlagsStorage<QNetworkProxy::Capability>.i & 0x10) == 0) {
    CVar6 = QNetworkProxy::capabilities(&this->channels->proxy);
    if (((uint)CVar6.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
               super_QFlagsStorage<QNetworkProxy::Capability>.i & 0x10) != 0) {
      this_00 = &this->channels->proxy;
      goto LAB_00203833;
    }
  }
  else {
LAB_00203833:
    QNetworkProxy::hostName(&local_48,this_00);
    qVar4 = local_48.d.size;
    pDVar3 = local_48.d.d;
    pcVar2 = local_68.d.ptr;
    pDVar1 = local_68.d.d;
    local_48.d.d = local_68.d.d;
    local_68.d.d = pDVar3;
    local_68.d.ptr = local_48.d.ptr;
    local_48.d.ptr = pcVar2;
    local_48.d.size = local_68.d.size;
    local_68.d.size = qVar4;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
  }
  local_70.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_70);
  bVar5 = QHostAddress::setAddress(&local_70,&local_68);
  if (bVar5) {
    NVar7 = QHostAddress::protocol(&local_70);
    if (NVar7 == IPv6Protocol) {
      this->networkLayerState = IPv6;
    }
    else {
      if (NVar7 != IPv4Protocol) goto LAB_0020395c;
      this->networkLayerState = IPv4;
    }
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char16_t *)0x0;
    local_48.d.size = 0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)&this->field_0x8,"_q_startNextRequest",QueuedConnection,1,
               (void **)&local_48,(char **)&local_48.d.ptr,(QMetaTypeInterface **)&local_48.d.size);
  }
  else {
    local_75[1] = -0x56;
    local_75[2] = -0x56;
    local_75[3] = -0x56;
    local_75[4] = -0x56;
    local_75[0] = '\0';
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    qt_qhostinfo_lookup(&local_48,(QObject *)&local_68,*(char **)&this->field_0x8,
                        (bool *)"1_q_hostLookupFinished(QHostInfo)",(int *)local_75);
    if (local_75[0] == '\x01') {
      _q_hostLookupFinished(this,(QHostInfo *)&local_48);
    }
    QHostInfo::~QHostInfo((QHostInfo *)&local_48);
  }
LAB_0020395c:
  QHostAddress::~QHostAddress(&local_70);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::startHostInfoLookup()
{
    networkLayerState = HostLookupPending;

    // check if we already now can decide if this is IPv4 or IPv6
    QString lookupHost = hostName;
#ifndef QT_NO_NETWORKPROXY
    if (networkProxy.capabilities() & QNetworkProxy::HostNameLookupCapability) {
        lookupHost = networkProxy.hostName();
    } else if (channels[0].proxy.capabilities() & QNetworkProxy::HostNameLookupCapability) {
        lookupHost = channels[0].proxy.hostName();
    }
#endif
    QHostAddress temp;
    if (temp.setAddress(lookupHost)) {
        const QAbstractSocket::NetworkLayerProtocol protocol = temp.protocol();
        if (protocol == QAbstractSocket::IPv4Protocol) {
            networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
            QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
            return;
        } else if (protocol == QAbstractSocket::IPv6Protocol) {
            networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
            QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
    } else {
        int hostLookupId;
        bool immediateResultValid = false;
        QHostInfo hostInfo = qt_qhostinfo_lookup(lookupHost,
                                                 this->q_func(),
                                                 SLOT(_q_hostLookupFinished(QHostInfo)),
                                                 &immediateResultValid,
                                                 &hostLookupId);
        if (immediateResultValid) {
            _q_hostLookupFinished(hostInfo);
        }
    }
}